

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::_::CidrRange::CidrRange(CidrRange *this,StringPtr pattern)

{
  size_t __n;
  bool bVar1;
  uint uVar2;
  int iVar3;
  NullableValue<unsigned_long> *pNVar4;
  unsigned_long *puVar5;
  ulong size;
  char *pcVar6;
  char *__src;
  ArrayPtr<char> AVar7;
  Fault local_168;
  Fault f_2;
  Fault f_1;
  Fault f;
  undefined1 local_140 [8];
  ArrayPtr<char> addr;
  Array<char> addr_heap;
  char addr_stack [128];
  bool addr_isOnStack;
  size_t addr_size;
  Fault local_70 [3];
  StringPtr local_58;
  undefined1 local_48 [8];
  NullableValue<unsigned_long> _kj_result;
  size_t slashPos;
  CidrRange *this_local;
  StringPtr pattern_local;
  
  pattern_local.content.ptr = (char *)pattern.content.size_;
  this_local = (CidrRange *)pattern.content.ptr;
  StringPtr::findFirst(&local_58,(char)&this_local);
  pNVar4 = readMaybe<unsigned_long>((Maybe<unsigned_long> *)&local_58);
  NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_48,pNVar4);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_58);
  puVar5 = _::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_48);
  if (puVar5 == (unsigned_long *)0x0) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
              (local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x7cb,FAILED,"pattern.findFirst(\'/\') != nullptr","\"invalid CIDR\", pattern",
               (char (*) [13])"invalid CIDR",(StringPtr *)&this_local);
    Debug::Fault::fatal(local_70);
  }
  pNVar4 = mv<kj::_::NullableValue<unsigned_long>>((NullableValue<unsigned_long> *)local_48);
  NullableValue<unsigned_long>::NullableValue
            ((NullableValue<unsigned_long> *)&_kj_result.field_1,pNVar4);
  NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_48);
  puVar5 = NullableValue<unsigned_long>::operator*
                     ((NullableValue<unsigned_long> *)&_kj_result.field_1);
  __n = *puVar5;
  NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)&_kj_result.field_1);
  _addr_size = (ArrayPtr<const_char>)StringPtr::slice((StringPtr *)&this_local,__n + 1);
  uVar2 = StringPtr::parseAs<unsigned_int>((StringPtr *)&addr_size);
  this->bitCount = uVar2;
  size = __n + 1;
  if (size < 0x81) {
    Array<char>::Array((Array<char> *)&addr.size_,(void *)0x0);
    AVar7 = arrayPtr<char>((char *)&addr_heap.disposer,size);
  }
  else {
    heapArray<char>((Array<char> *)&addr.size_,size);
    AVar7 = kj::Array::operator_cast_to_ArrayPtr((Array *)&addr.size_);
  }
  addr.ptr = (char *)AVar7.size_;
  local_140 = (undefined1  [8])AVar7.ptr;
  pcVar6 = ArrayPtr<char>::begin((ArrayPtr<char> *)local_140);
  __src = StringPtr::begin((StringPtr *)&this_local);
  memcpy(pcVar6,__src,__n);
  pcVar6 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)local_140,__n);
  *pcVar6 = '\0';
  StringPtr::findFirst((StringPtr *)&f,(char)&this_local);
  bVar1 = Maybe<unsigned_long>::operator==((Maybe<unsigned_long> *)&f,(void *)0x0);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&f);
  if (bVar1) {
    this->family = 2;
    if (0x20 < this->bitCount) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x7d5,FAILED,"bitCount <= 32","\"invalid CIDR\", pattern",
                 (char (*) [13])"invalid CIDR",(StringPtr *)&this_local);
      Debug::Fault::fatal(&f_1);
    }
  }
  else {
    this->family = 10;
    if (0x80 < this->bitCount) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
                (&f_2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x7d8,FAILED,"bitCount <= 128","\"invalid CIDR\", pattern",
                 (char (*) [13])"invalid CIDR",(StringPtr *)&this_local);
      Debug::Fault::fatal(&f_2);
    }
  }
  iVar3 = this->family;
  pcVar6 = ArrayPtr<char>::begin((ArrayPtr<char> *)local_140);
  iVar3 = inet_pton(iVar3,pcVar6,this->bits);
  if (0 < iVar3) {
    zeroIrrelevantBits(this);
    Array<char>::~Array((Array<char> *)&addr.size_);
    return;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
            (&local_168,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x7db,FAILED,"inet_pton(family, addr.begin(), bits) > 0","\"invalid CIDR\", pattern",
             (char (*) [13])"invalid CIDR",(StringPtr *)&this_local);
  Debug::Fault::fatal(&local_168);
}

Assistant:

CidrRange::CidrRange(StringPtr pattern) {
  size_t slashPos = KJ_REQUIRE_NONNULL(pattern.findFirst('/'), "invalid CIDR", pattern);

  bitCount = pattern.slice(slashPos + 1).parseAs<uint>();

  KJ_STACK_ARRAY(char, addr, slashPos + 1, 128, 128);
  memcpy(addr.begin(), pattern.begin(), slashPos);
  addr[slashPos] = '\0';

  if (pattern.findFirst(':') == nullptr) {
    family = AF_INET;
    KJ_REQUIRE(bitCount <= 32, "invalid CIDR", pattern);
  } else {
    family = AF_INET6;
    KJ_REQUIRE(bitCount <= 128, "invalid CIDR", pattern);
  }

  KJ_ASSERT(inet_pton(family, addr.begin(), bits) > 0, "invalid CIDR", pattern);
  zeroIrrelevantBits();
}